

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *
jbcoin::STObject::getSortedFields
          (vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
           *__return_storage_ptr__,STObject *objToSort)

{
  pointer *pppSVar1;
  pointer pSVar2;
  STBase *pSVar3;
  iterator __position;
  pointer ppSVar4;
  pointer ppSVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  pointer ppSVar9;
  pointer ppSVar10;
  STVar *elem;
  pointer pSVar11;
  STBase *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::reserve
            (__return_storage_ptr__,
             (long)((int)((ulong)((long)(objToSort->v_).
                                        super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(objToSort->v_).
                                       super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                   -0x55555555));
  pSVar11 = (objToSort->v_).
            super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (objToSort->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pSVar11 != pSVar2) {
    do {
      pSVar3 = pSVar11->p_;
      iVar7 = (*pSVar3->_vptr_STBase[4])(pSVar3);
      if ((iVar7 != 0) && (pSVar3->fName->fieldValue < 0x100)) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        local_30 = pSVar3;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>::
          _M_realloc_insert<jbcoin::STBase_const*>
                    ((vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>> *)
                     __return_storage_ptr__,__position,&local_30);
        }
        else {
          *__position._M_current = pSVar3;
          pppSVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
      }
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 != pSVar2);
  }
  ppSVar4 = (__return_storage_ptr__->
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar5 = (__return_storage_ptr__->
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar4 != ppSVar5) {
    uVar8 = (long)ppSVar5 - (long)ppSVar4 >> 3;
    lVar6 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
              (ppSVar4,ppSVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppSVar5 - (long)ppSVar4 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
                (ppSVar4,ppSVar5);
    }
    else {
      ppSVar10 = ppSVar4 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
                (ppSVar4,ppSVar10);
      for (; ppSVar10 != ppSVar5; ppSVar10 = ppSVar10 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
                  (ppSVar10);
      }
    }
  }
  ppSVar4 = (__return_storage_ptr__->
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar5 = (__return_storage_ptr__->
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  ppSVar10 = ppSVar5;
  if (ppSVar4 != ppSVar5) {
    do {
      ppSVar9 = ppSVar4 + 1;
      ppSVar10 = ppSVar5;
      if (ppSVar9 == ppSVar5) break;
      pSVar3 = *ppSVar4;
      ppSVar10 = ppSVar4;
      ppSVar4 = ppSVar9;
    } while (pSVar3 != *ppSVar9);
  }
  if (ppSVar10 != ppSVar5) {
    __assert_fail("std::adjacent_find (sf.cbegin (), sf.cend ()) == sf.cend ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2f4,
                  "static std::vector<const STBase *> jbcoin::STObject::getSortedFields(const STObject &)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STBase const*>
STObject::getSortedFields (STObject const& objToSort)
{
    std::vector<STBase const*> sf;
    sf.reserve (objToSort.getCount ());

    // Choose the fields that we need to sort.
    for (detail::STVar const& elem : objToSort.v_)
    {
        // Pick out the fields and sort them.
        STBase const& base = elem.get();
        if ((base.getSType () != STI_NOTPRESENT) &&
            base.getFName ().shouldInclude (true))
        {
            sf.push_back (&base);
        }
    }

    // Sort the fields by fieldCode.
    std::sort (sf.begin (), sf.end (),
        [] (STBase const* a, STBase const* b) -> bool
        {
            return a->getFName ().fieldCode < b->getFName ().fieldCode;
        });

    // There should never be duplicate fields in an STObject. Verify that
    // in debug mode.
    assert (std::adjacent_find (sf.cbegin (), sf.cend ()) == sf.cend ());

    return sf;
}